

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmComputeShaderCase.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)8>_> *
anon_unknown.dwarf_77b893::createBufferAndBindMemory
          (Move<vk::Handle<(vk::HandleType)8>_> *__return_storage_ptr__,DeviceInterface *vkdi,
          VkDevice *device,Allocator *allocator,size_t numBytes,AllocationMp *outMemory)

{
  undefined1 auVar1 [16];
  VkResult result;
  AllocationMp bufferMemory;
  VkMemoryRequirements requirements;
  VkBufferCreateInfo bufferCreateInfo;
  
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo.usage = 0x20;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
  bufferCreateInfo.size = numBytes;
  ::vk::createBuffer(__return_storage_ptr__,vkdi,*device,&bufferCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  ::vk::getBufferMemoryRequirements
            (&requirements,vkdi,*device,
             (VkBuffer)
             (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.
             m_internal);
  (*allocator->_vptr_Allocator[3])(&bufferMemory,allocator,&requirements,1);
  result = (*vkdi->_vptr_DeviceInterface[0xc])
                     (vkdi,*device,
                      (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data
                      .object.m_internal,
                      ((bufferMemory.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                       .ptr)->m_memory).m_internal,
                      (bufferMemory.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_offset);
  ::vk::checkResult(result,
                    "vkdi.bindBufferMemory(device, *buffer, bufferMemory->getMemory(), bufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/spirv_assembly/vktSpvAsmComputeShaderCase.cpp"
                    ,0x46);
  bufferMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = bufferMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                 m_data._8_8_;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&outMemory->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,
             (PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>)(auVar1 << 0x40));
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&bufferMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  return __return_storage_ptr__;
}

Assistant:

Move<VkBuffer> createBufferAndBindMemory (const DeviceInterface& vkdi, const VkDevice& device, Allocator& allocator, size_t numBytes, AllocationMp* outMemory)
{
	const VkBufferCreateInfo bufferCreateInfo =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// sType
		DE_NULL,								// pNext
		0u,										// flags
		numBytes,								// size
		VK_BUFFER_USAGE_STORAGE_BUFFER_BIT,		// usage
		VK_SHARING_MODE_EXCLUSIVE,				// sharingMode
		0u,										// queueFamilyCount
		DE_NULL,								// pQueueFamilyIndices
	};

	Move<VkBuffer>				buffer			(createBuffer(vkdi, device, &bufferCreateInfo));
	const VkMemoryRequirements	requirements	= getBufferMemoryRequirements(vkdi, device, *buffer);
	AllocationMp				bufferMemory	= allocator.allocate(requirements, MemoryRequirement::HostVisible);

	VK_CHECK(vkdi.bindBufferMemory(device, *buffer, bufferMemory->getMemory(), bufferMemory->getOffset()));
	*outMemory = bufferMemory;

	return buffer;
}